

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O3

int UpnpNotifyExt(UpnpDevice_Handle Hnd,char *DevID_const,char *ServName_const,
                 IXML_Document *PropSet)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  int line;
  char *file;
  Handle_Info *pHStack_28;
  
  line = (int)&pHStack_28;
  iVar2 = -0x74;
  if (UpnpSdkInit == 1) {
    iVar2 = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xa6b,"Inside UpnpNotify \n");
    HandleReadLock((char *)0xa6d,iVar2);
    UVar1 = GetHandleInfo(Hnd,&pHStack_28);
    if (UVar1 == HND_DEVICE) {
      if (DevID_const == (char *)0x0) {
        file = (char *)0xa76;
      }
      else {
        if (ServName_const != (char *)0x0) {
          HandleUnlock((char *)0xa7e,line);
          iVar2 = genaNotifyAllExt(Hnd,DevID_const,ServName_const,PropSet);
          UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xa81,"Exiting UpnpNotify \n");
          return iVar2;
        }
        file = (char *)0xa7a;
      }
      HandleUnlock(file,line);
      iVar2 = -0x65;
    }
    else {
      HandleUnlock((char *)0xa72,line);
      iVar2 = -100;
    }
  }
  return iVar2;
}

Assistant:

int UpnpNotifyExt(UpnpDevice_Handle Hnd,
	const char *DevID_const,
	const char *ServName_const,
	IXML_Document *PropSet)
{
	struct Handle_Info *SInfo = NULL;
	int retVal;
	char *DevID = (char *)DevID_const;
	char *ServName = (char *)ServName_const;

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL, API, __FILE__, __LINE__, "Inside UpnpNotify \n");

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if (DevID == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	if (ServName == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}

	HandleUnlock(__FILE__, __LINE__);
	retVal = genaNotifyAllExt(Hnd, DevID, ServName, PropSet);

	UpnpPrintf(UPNP_ALL, API, __FILE__, __LINE__, "Exiting UpnpNotify \n");

	return retVal;
}